

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<VectorWriter,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>
          (VectorFormatter<DefaultFormatter> *this,VectorWriter *s,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *v)

{
  long lVar1;
  bool bVar2;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *in_RSI;
  long in_FS_OFFSET;
  value_type *elem;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  VectorWriter *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::size
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_ffffffffffffffa8);
  WriteCompactSize<VectorWriter>((VectorWriter *)in_stack_ffffffffffffffb8,(uint64_t)in_RSI);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::begin(in_RSI);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                      ((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::
         __normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
         ::operator*((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                      *)in_stack_ffffffffffffffa8);
    DefaultFormatter::Ser<VectorWriter,CBlockHeader>
              (in_stack_ffffffffffffffa8,(CBlockHeader *)0x32d6f3);
    __gnu_cxx::
    __normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
    ::operator++((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                  *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }